

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

bool __thiscall
crnlib::
hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
::insert_no_grow(hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
                 *this,insert_result *result,vec<16U,_float> *k,uint *v)

{
  long lVar1;
  float fVar2;
  raw_node *prVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  uint32 uVar12;
  uint uVar13;
  raw_node *prVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar12 = fast_hash(k,0x40);
  uVar15 = uVar12 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
  prVar3 = (this->m_values).m_p;
  prVar14 = prVar3 + uVar15;
  if (prVar14->m_bits[0x44] != '\0') {
    fVar2 = k->m_s[0];
    if ((*(float *)prVar14->m_bits == fVar2) && (!NAN(*(float *)prVar14->m_bits) && !NAN(fVar2))) {
      uVar17 = 0xffffffffffffffff;
      while (uVar17 != 0xe) {
        lVar1 = uVar17 * 4;
        uVar18 = uVar17 + 1;
        lVar11 = uVar17 + 2;
        if ((*(float *)(prVar3[uVar15].m_bits + lVar1 + 8) != k->m_s[lVar11]) ||
           (uVar17 = uVar18,
           NAN(*(float *)(prVar3[uVar15].m_bits + lVar1 + 8)) || NAN(k->m_s[lVar11])))
        goto LAB_0018787c;
      }
      uVar18 = 0xf;
LAB_0018787c:
      if (0xe < uVar18) {
        bVar20 = false;
        goto LAB_00187952;
      }
    }
    uVar13 = (this->m_values).m_size - 1;
    uVar16 = uVar15 - 1;
    if (uVar15 == 0) {
      uVar16 = uVar13;
    }
    prVar14 = prVar14 + -1;
    if (uVar15 == 0) {
      prVar14 = prVar3 + uVar13;
    }
    if (uVar15 == uVar16) {
      bVar20 = false;
    }
    else {
      do {
        bVar20 = prVar14->m_bits[0x44] == '\0';
        if (bVar20) break;
        if ((*(float *)prVar14->m_bits == fVar2) && (!NAN(*(float *)prVar14->m_bits) && !NAN(fVar2))
           ) {
          uVar17 = 0xffffffffffffffff;
          while (uVar17 != 0xe) {
            lVar11 = uVar17 * 4;
            uVar18 = uVar17 + 1;
            lVar1 = uVar17 + 2;
            if ((*(float *)(prVar14->m_bits + lVar11 + 8) != k->m_s[lVar1]) ||
               (uVar17 = uVar18, NAN(*(float *)(prVar14->m_bits + lVar11 + 8)) || NAN(k->m_s[lVar1])
               )) goto LAB_001878f1;
          }
          uVar18 = 0xf;
LAB_001878f1:
          if (0xe < uVar18) {
            (result->first).m_pTable = this;
            (result->first).m_index = uVar16;
            result->second = false;
            bVar19 = true;
            bVar20 = false;
            uVar15 = uVar16;
            goto LAB_0018790b;
          }
        }
        bVar19 = uVar16 == 0;
        prVar14 = prVar14 + -1;
        uVar16 = uVar16 - 1;
        if (bVar19) {
          prVar14 = prVar3 + uVar13;
          uVar16 = uVar13;
        }
      } while (uVar15 != uVar16);
    }
    bVar19 = false;
    uVar15 = uVar16;
LAB_0018790b:
    if (!bVar20) {
      return bVar19;
    }
  }
  if (this->m_grow_threshold <= this->m_num_valid) {
    return false;
  }
  uVar4 = *(undefined8 *)k->m_s;
  uVar5 = *(undefined8 *)(k->m_s + 2);
  uVar6 = *(undefined8 *)(k->m_s + 4);
  uVar7 = *(undefined8 *)(k->m_s + 6);
  uVar8 = *(undefined8 *)(k->m_s + 8);
  uVar9 = *(undefined8 *)(k->m_s + 10);
  uVar10 = *(undefined8 *)(k->m_s + 0xe);
  *(undefined8 *)(prVar14->m_bits + 0x30) = *(undefined8 *)(k->m_s + 0xc);
  *(undefined8 *)(prVar14->m_bits + 0x38) = uVar10;
  *(undefined8 *)(prVar14->m_bits + 0x20) = uVar8;
  *(undefined8 *)(prVar14->m_bits + 0x28) = uVar9;
  *(undefined8 *)(prVar14->m_bits + 0x10) = uVar6;
  *(undefined8 *)(prVar14->m_bits + 0x18) = uVar7;
  *(undefined8 *)prVar14->m_bits = uVar4;
  *(undefined8 *)(prVar14->m_bits + 8) = uVar5;
  *(uint *)(prVar14->m_bits + 0x40) = *v;
  prVar14->m_bits[0x44] = '\x01';
  this->m_num_valid = this->m_num_valid + 1;
  bVar20 = true;
LAB_00187952:
  (result->first).m_pTable = this;
  (result->first).m_index = uVar15;
  result->second = bVar20;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value())
        {
            if (!m_values.size())
            {
                return false;
            }

            int index = hash_key(k);
            node* pNode = &get_node(index);

            if (pNode->state)
            {
                if (m_equals(pNode->first, k))
                {
                    result.first = iterator(*this, index);
                    result.second = false;
                    return true;
                }

                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pNode = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (orig_index == index)
                    {
                        return false;
                    }

                    if (!pNode->state)
                    {
                        break;
                    }

                    if (m_equals(pNode->first, k))
                    {
                        result.first = iterator(*this, index);
                        result.second = false;
                        return true;
                    }
                }
            }

            if (m_num_valid >= m_grow_threshold)
            {
                return false;
            }

            construct_value_type(pNode, k, v);

            pNode->state = cStateValid;

            m_num_valid++;
            CRNLIB_ASSERT(m_num_valid <= m_values.size());

            result.first = iterator(*this, index);
            result.second = true;

            return true;
        }